

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
               (RecyclableObject *obj,BigIndex *toIndex,unsigned_long start,unsigned_long end,
               ScriptContext *scriptContext)

{
  BOOL BVar1;
  Var newValue;
  BigIndex BVar2;
  undefined1 local_80 [8];
  BigIndex dst;
  BigIndex newEnd;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  jsReentLock._24_8_ = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,obj);
  if (start < end) {
    BigIndex::BigIndex((BigIndex *)&dst.bigIndex,~start + end);
    BVar2 = BigIndex::operator+(toIndex,(BigIndex *)&dst.bigIndex);
    dst._0_8_ = BVar2.bigIndex;
    local_80._0_4_ = BVar2.index;
    while (start < end) {
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      end = end - 1;
      BVar1 = JavascriptOperators::HasItem(obj,end);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar1 == 0) {
        BVar1 = BigIndex::DeleteItem
                          ((BigIndex *)local_80,obj,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar1 == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      }
      else {
        newValue = JavascriptOperators::GetItem(obj,end,(ScriptContext *)jsReentLock._24_8_);
        BVar1 = BigIndex::SetItem((BigIndex *)local_80,obj,newValue,
                                  PropertyOperation_ThrowIfNotExtensible);
        if (BVar1 == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      }
      *(bool *)((long)local_58 + 0x108) = true;
      BigIndex::operator--((BigIndex *)local_80);
    }
  }
  *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }